

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void kratos::stmt_set_right(AssignStmt *stmt,Var *target,Var *new_var)

{
  InternalException *this;
  Var **var;
  _Alloc_hider local_40;
  pointer local_38;
  
  var = &stmt->right_;
  switch(stmt->right_->type_) {
  case Base:
  case ConstValue:
  case PortIO:
    if (stmt->right_ != target) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_p = &stack0xffffffffffffffd0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffffc0,"Target not found","");
      InternalException::InternalException(this,(string *)&stack0xffffffffffffffc0);
      __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &new_var->super_enable_shared_from_this<kratos::Var>);
    *var = (Var *)local_40._M_p;
    if (local_38 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      local_40._M_p = (pointer)*var;
    }
    (*(((Var *)local_40._M_p)->super_IRNode)._vptr_IRNode[0x14])(local_40._M_p,new_var);
    break;
  case Expression:
    Var::as<kratos::Expr>((Var *)&stack0xffffffffffffffc0);
    change_var_expr((shared_ptr<kratos::Expr> *)&stack0xffffffffffffffc0,target,new_var,true);
    if (local_38 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
    break;
  case Slice:
    set_slice_var_parent(var,target,new_var,true);
    return;
  default:
    change_var_parent(var,target,new_var);
    return;
  }
  return;
}

Assistant:

void stmt_set_right(AssignStmt *stmt, Var *target, Var *new_var) {
    auto &right = stmt->right();
    if (right->type() == VarType::Base || right->type() == VarType::PortIO ||
        right->type() == VarType::ConstValue) {
        if (right == target) {
            stmt->set_right(new_var->shared_from_this());
            right->move_linked_to(new_var);
        } else {
            throw InternalException("Target not found");
        }
    } else if (right->type() == VarType::Slice) {
        set_slice_var_parent(right, target, new_var, true);
    } else if (right->type() == VarType::Expression) {
        change_var_expr(stmt->right()->as<Expr>(), target, new_var);
    } else {
        change_var_parent(right, target, new_var);
    }
}